

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqvm.cpp
# Opt level: O1

bool __thiscall SQVM::Return<false>(SQVM *this,SQInteger _arg0,SQInteger _arg1,SQObjectPtr *retval)

{
  SQUnsignedInteger *pSVar1;
  SQObjectPtr *pSVar2;
  SQObjectType SVar3;
  CallInfo *pCVar4;
  SQBool SVar5;
  SQTable *pSVar6;
  SQFloat SVar7;
  undefined4 uVar8;
  SQObjectFlags SVar9;
  undefined3 uVar10;
  
  pCVar4 = this->ci;
  SVar5 = pCVar4->_root;
  if (SVar5 == 0) {
    if ((long)pCVar4->_target == -1) {
      retval = (SQObjectPtr *)0x0;
    }
    else {
      retval = (this->_stack)._vals +
               (this->_stackbase - (long)pCVar4->_prevstkbase) + (long)pCVar4->_target;
    }
  }
  if (retval != (SQObjectPtr *)0x0) {
    if (_arg0 == 0xff) {
      pSVar6 = (retval->super_SQObject)._unVal.pTable;
      SVar3 = (retval->super_SQObject)._type;
      (retval->super_SQObject)._type = 0;
      (retval->super_SQObject)._flags = '\0';
      *(undefined3 *)&(retval->super_SQObject).field_0x5 = 0;
      (retval->super_SQObject)._unVal.pTable = (SQTable *)0x0;
      (retval->super_SQObject)._type = OT_NULL;
    }
    else {
      SVar3 = (retval->super_SQObject)._type;
      pSVar6 = (retval->super_SQObject)._unVal.pTable;
      pSVar2 = (this->_stack)._vals + this->_stackbase + _arg1;
      SVar9 = (pSVar2->super_SQObject)._flags;
      uVar10 = *(undefined3 *)&(pSVar2->super_SQObject).field_0x5;
      SVar7 = (pSVar2->super_SQObject)._unVal.fFloat;
      uVar8 = *(undefined4 *)((long)&(pSVar2->super_SQObject)._unVal + 4);
      (retval->super_SQObject)._type = (pSVar2->super_SQObject)._type;
      (retval->super_SQObject)._flags = SVar9;
      *(undefined3 *)&(retval->super_SQObject).field_0x5 = uVar10;
      (retval->super_SQObject)._unVal.fFloat = SVar7;
      *(undefined4 *)((long)&(retval->super_SQObject)._unVal + 4) = uVar8;
      if (((retval->super_SQObject)._type & 0x8000000) != 0) {
        pSVar1 = &(((retval->super_SQObject)._unVal.pTable)->super_SQDelegable).super_SQCollectable.
                  super_SQRefCounted._uiRef;
        *pSVar1 = *pSVar1 + 1;
      }
    }
    if ((SVar3 >> 0x1b & 1) != 0) {
      pSVar1 = &(pSVar6->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
      *pSVar1 = *pSVar1 - 1;
      if (*pSVar1 == 0) {
        (*(pSVar6->super_SQDelegable).super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted[2])
                  ();
      }
    }
  }
  LeaveFrame(this);
  return SVar5 != 0;
}

Assistant:

bool SQVM::Return(SQInteger _arg0, SQInteger _arg1, SQObjectPtr &retval)
{
    SQBool    _isroot      = ci->_root;
    SQInteger callerbase   = _stackbase - ci->_prevstkbase;
    if constexpr (debughookPresent)
    {
        if (_debughook) {
            for(SQInteger i=0; i<ci->_ncalls; i++) {
                CallDebugHook(_SC('r'));
            }
        }
    }

    SQObjectPtr *dest;
    if (_isroot) {
        dest = &(retval);
    } else if (ci->_target == -1) {
        dest = NULL;
    } else {
        dest = &_stack._vals[callerbase + ci->_target];
    }
    if (dest) {
        if(_arg0 != 0xFF) {
            *dest = _stack._vals[_stackbase+_arg1];
        }
        else {
            dest->Null();
        }
        //*dest = (_arg0 != 0xFF) ? _stack._vals[_stackbase+_arg1] : _null_;
    }
    LeaveFrame();
    return _isroot ? true : false;
}